

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O3

void __thiscall mau::DeliveryChannel::postNextTimer(DeliveryChannel *this)

{
  Lock *__mutex;
  QueueNode *pQVar1;
  uint64_t uVar2;
  _Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
  _Var3;
  long lVar4;
  int iVar5;
  uint64_t uVar6;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32)>
  *op;
  error_category *peVar7;
  thread_info_base *this_thread;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_50;
  ptr local_48;
  
  __mutex = &this->QueueLock;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pQVar1 = (this->Queue).Head;
  if ((pQVar1 != (QueueNode *)0x0) &&
     (uVar2 = pQVar1->DeliveryUsec,
     (long)(uVar2 - this->NextTimerWakeUsec) < 0 || this->NextTimerWakeUsec == 0)) {
    this->NextTimerWakeUsec = uVar2;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    uVar6 = GetTimeUsec();
    local_48.h = (anon_class_8_1_8991fb9c *)
                 ((~((long)(uVar2 - uVar6) >> 0x3f) & uVar2 - uVar6) * 1000);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
    ::expires_after((this->DeliveryTimer)._M_t.
                    super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                    .
                    super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
                    ._M_head_impl,(duration *)&local_48);
    _Var3._M_head_impl =
         (this->DeliveryTimer)._M_t.
         super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
         .
         super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
         ._M_head_impl;
    local_48.h = &local_50;
    lVar4 = *(long *)&(_Var3._M_head_impl)->
                      super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
    ;
    if (*(long *)(in_FS_OFFSET + -8) == 0) {
      this_thread = (thread_info_base *)0x0;
    }
    else {
      this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
    }
    local_50.this = this;
    op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32)>
          *)asio::detail::thread_info_base::allocate(this_thread,0x30);
    (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
    (op->super_wait_op).super_operation.func_ =
         asio::detail::
         wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:310:32)>
         ::do_complete;
    (op->super_wait_op).super_operation.task_result_ = 0;
    (op->super_wait_op).ec_._M_value = 0;
    local_48.v = op;
    peVar7 = (error_category *)std::_V2::system_category();
    (op->super_wait_op).ec_._M_cat = peVar7;
    (op->handler_).this = local_50.this;
    *(bool *)((long)&(_Var3._M_head_impl)->
                     super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
             + 0x10) = true;
    local_48.p = op;
    asio::detail::epoll_reactor::
    schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
              (*(epoll_reactor **)(lVar4 + 0x58),
               (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                *)(lVar4 + 0x28),
               (time_type *)
               ((long)&(_Var3._M_head_impl)->
                       super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
               + 8),(per_timer_data *)
                    ((long)&(_Var3._M_head_impl)->
                            super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                    + 0x18),(wait_op *)op);
    local_48.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32)>
                  *)0x0;
    local_48.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:310:32)>
                  *)0x0;
    asio::detail::
    wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:310:32)>
    ::ptr::reset(&local_48);
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void DeliveryChannel::postNextTimer()
{
    uint64_t nextTimerWakeUsec = 0;

    {
        Locker locker(QueueLock);

        // Read next target wake time
        QueueNode* frontNode = Queue.Peek();
        if (!frontNode) {
            // No data in the queue
            return;
        }

        nextTimerWakeUsec = frontNode->DeliveryUsec;

        // If we are already waiting for an earlier (or same) time:
        if (NextTimerWakeUsec != 0 &&
            (int64_t)(nextTimerWakeUsec - NextTimerWakeUsec) >= 0)
        {
            // Current wake-up time is sooner
            return;
        }

        NextTimerWakeUsec = nextTimerWakeUsec;
    }

    // Calculate when the timer should fire
    uint64_t aheadUsec = 0;
    const uint64_t nowUsec = GetTimeUsec();
    const int64_t deltaUsec = (int64_t)(nextTimerWakeUsec - nowUsec);
    if (deltaUsec > 0) {
        aheadUsec = deltaUsec;
    }

    //Common->Logger.Info("Waiting for ", aheadUsec, " usec");

    // Update timer to new time
    DeliveryTimer->expires_after(std::chrono::microseconds(aheadUsec));

    DeliveryTimer->async_wait(([this](const asio::error_code& error)
    {
        // Clear the next wakeup time to allow the next one to be set
        // concurrently (see above)
        {
            Locker locker(QueueLock);
            NextTimerWakeUsec = 0;
        }

        if (error)
        {
            // Do not report errors here.
            // They happen normally as we cancel and restart the timers
            // to wake them up sooner
            //ModuleLogger.Warning("DeliveryChannel timer error: ", error.message());
            return;
        }

        UDPAddress destAddress = DeliveryAddress.Get();
        if (destAddress.address().is_unspecified())
        {
            Common->Logger.Info("Delivery address unspecified - Abort");
            return; // Still waiting for hostname resolution
        }

        QueueNode* node;
        const uint64_t nowUsec = GetTimeUsec();

        for (;;)
        {
            {
                Locker locker(QueueLock);

                node = Queue.Peek();
                if (!node) {
                    break;
                }

                if ((int64_t)(nowUsec - node->DeliveryUsec) < 0) {
                    break;
                }

                Queue.Pop();
            }

            //Common->Logger.Info("Forwarding at ", node->TargetDeliveryUsec, " off by ", (int64_t)(nowUsec - node->TargetDeliveryUsec));

            void* nodeData = &node->Data[0];

            if (Common->ProxyConfig.SendHook)
            {
                Common->ProxyConfig.SendHook(
                    Common->ProxyConfig.SendHookContext,
                    destAddress.port(),
                    nodeData,
                    node->Bytes
                );

                Common->ReadBufferAllocator.Free(node);
            }
            else
            {
                Common->Socket->async_send_to(
                    asio::buffer(nodeData, node->Bytes),
                    destAddress, [this, node](const asio::error_code&, std::size_t)
                {
                    Common->ReadBufferAllocator.Free(node);
                });
            }
        }

        postNextTimer();
    }));
}